

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_char8_t_*>::Print(char8_t *str,ostream *os)

{
  allocator<char8_t> local_31;
  u8string local_30 [32];
  
  if (str != (char8_t *)0x0) {
    std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_30,str,&local_31);
    testing::internal::PrintU8StringTo(local_30,os);
    std::__cxx11::u8string::~u8string(local_30);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void Print(const char8_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u8string(str), os);
    }
  }